

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearlyTransformedCosines.cpp
# Opt level: O2

void __thiscall
arealights::LinearlyTransformedCosines::~LinearlyTransformedCosines
          (LinearlyTransformedCosines *this)

{
  std::vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_>::~vector
            (&this->_lights);
  std::unique_ptr<fw::Texture,_std::default_delete<fw::Texture>_>::~unique_ptr
            (&this->_ltcLookupMatB);
  std::unique_ptr<fw::Texture,_std::default_delete<fw::Texture>_>::~unique_ptr
            (&this->_ltcLookupMatA);
  std::unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>::~unique_ptr
            (&this->_ltcShader);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_renderHelper).
              super___shared_ptr<arealights::RenderHelper,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

LinearlyTransformedCosines::~LinearlyTransformedCosines()
{
}